

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

void set_restoration_unit_size(AV1_COMMON *cm,RestorationInfo *rsi,int is_uv,int luma_unit_size)

{
  int iVar1;
  int iVar2;
  int plane_h;
  int plane_w;
  int local_30;
  int local_2c;
  
  av1_get_upsampled_plane_size(cm,is_uv,&local_2c,&local_30);
  iVar1 = av1_lr_count_units(luma_unit_size,local_2c);
  iVar2 = av1_lr_count_units(luma_unit_size,local_30);
  rsi->restoration_unit_size = luma_unit_size;
  rsi->num_rest_units = iVar2 * iVar1;
  rsi->horz_units = iVar1;
  rsi->vert_units = iVar2;
  return;
}

Assistant:

static void set_restoration_unit_size(AV1_COMMON *cm, RestorationInfo *rsi,
                                      int is_uv, int luma_unit_size) {
#if COUPLED_CHROMA_FROM_LUMA_RESTORATION
  int sx = cm->seq_params.subsampling_x;
  int sy = cm->seq_params.subsampling_y;
  int s = (p > 0) ? AOMMIN(sx, sy) : 0;
#else
  int s = 0;
#endif  // !COUPLED_CHROMA_FROM_LUMA_RESTORATION
  int unit_size = luma_unit_size >> s;

  int plane_w, plane_h;
  av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);

  const int horz_units = av1_lr_count_units(unit_size, plane_w);
  const int vert_units = av1_lr_count_units(unit_size, plane_h);

  rsi->restoration_unit_size = unit_size;
  rsi->num_rest_units = horz_units * vert_units;
  rsi->horz_units = horz_units;
  rsi->vert_units = vert_units;
}